

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libixy-vfio.c
# Opt level: O2

int vfio_disable_msi(int device_fd)

{
  int iVar1;
  int *piVar2;
  char irq_set_buf [24];
  char buf [512];
  
  fprintf(_stdout,"[INFO ] %s:%d %s(): Disable MSI Interrupts\n",
          "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/libixy-vfio.c",0x4b,
          "vfio_disable_msi");
  iVar1 = ioctl(device_fd,0x3b6e);
  if (iVar1 != -1) {
    return 0;
  }
  piVar2 = __errno_location();
  iVar1 = *piVar2;
  __xpg_strerror_r(iVar1,buf,0x200);
  fprintf(_stderr,"[ERROR] %s:%d %s(): Failed to %s: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/libixy-vfio.c",0x55,
          "vfio_disable_msi","disable MSI interrupts",buf);
  exit(iVar1);
}

Assistant:

int vfio_disable_msi(int device_fd) {
	info("Disable MSI Interrupts");
	char irq_set_buf[IRQ_SET_BUF_LEN];

	struct vfio_irq_set* irq_set = (struct vfio_irq_set*) irq_set_buf;
	irq_set->argsz = sizeof(irq_set_buf);
	irq_set->count = 0;
	irq_set->flags = VFIO_IRQ_SET_DATA_NONE | VFIO_IRQ_SET_ACTION_TRIGGER;
	irq_set->index = VFIO_PCI_MSI_IRQ_INDEX;
	irq_set->start = 0;

	check_err(ioctl(device_fd, VFIO_DEVICE_SET_IRQS, irq_set), "disable MSI interrupts");

	return 0;
}